

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_symbol_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValueUnion p;
  ulong uVar1;
  int64_t iVar2;
  ulong uVar3;
  JSValue JVar4;
  JSValue JVar5;
  
  if ((int)new_target.tag == 3) {
    if ((argc == 0) || ((int)argv->tag == 3)) {
      p.float64 = 0.0;
    }
    else {
      JVar4.tag = argv->tag;
      JVar4.u.ptr = (argv->u).ptr;
      JVar4 = JS_ToStringInternal(ctx,JVar4,0);
      p = JVar4.u;
      if ((int)JVar4.tag == 6) goto LAB_00131809;
    }
    JVar4 = JS_NewSymbol(ctx,(JSString *)p.ptr,3);
    iVar2 = JVar4.tag;
    uVar1 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
    uVar3 = (ulong)JVar4.u._0_4_;
  }
  else {
    JS_ThrowTypeError(ctx,"not a constructor");
LAB_00131809:
    uVar3 = 0;
    iVar2 = 6;
    uVar1 = 0;
  }
  JVar5.tag = iVar2;
  JVar5.u.ptr = (void *)(uVar3 | uVar1);
  return JVar5;
}

Assistant:

static JSValue js_symbol_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue str;
    JSString *p;

    if (!JS_IsUndefined(new_target))
        return JS_ThrowTypeError(ctx, "not a constructor");
    if (argc == 0 || JS_IsUndefined(argv[0])) {
        p = NULL;
    } else {
        str = JS_ToString(ctx, argv[0]);
        if (JS_IsException(str))
            return JS_EXCEPTION;
        p = JS_VALUE_GET_STRING(str);
    }
    return JS_NewSymbol(ctx, p, JS_ATOM_TYPE_SYMBOL);
}